

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::pushGLStates(RenderTarget *this)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long *in_RDI;
  Uint64 in_stack_00000008;
  GLenum error;
  char *in_stack_00000130;
  uint in_stack_0000013c;
  char *in_stack_00000140;
  undefined4 in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  
  bVar1 = anon_unknown.dwarf_73f79::isActive(in_stack_00000008);
  if ((bVar1) || (uVar2 = (**(code **)(*in_RDI + 0x18))(in_RDI,1), (uVar2 & 1) != 0)) {
    in_stack_fffffffffffffff4 = glGetError();
    if (in_stack_fffffffffffffff4 != 0) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"OpenGL error (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_stack_fffffffffffffff4);
      poVar3 = std::operator<<(poVar3,") detected in user code, ");
      poVar3 = std::operator<<(poVar3,"you should check for errors with glGetError()");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    glPushClientAttrib(0xffffffff);
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    glPushAttrib(0xffffffff);
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    glMatrixMode(0x1700);
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    glPushMatrix();
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    glMatrixMode(0x1701);
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    glPushMatrix();
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    glMatrixMode(0x1702);
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    glPushMatrix();
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  }
  resetGLStates((RenderTarget *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void RenderTarget::pushGLStates()
{
    if (isActive(m_id) || setActive(true))
    {
        #ifdef SFML_DEBUG
            // make sure that the user didn't leave an unchecked OpenGL error
            GLenum error = glGetError();
            if (error != GL_NO_ERROR)
            {
                err() << "OpenGL error (" << error << ") detected in user code, "
                      << "you should check for errors with glGetError()"
                      << std::endl;
            }
        #endif

        #ifndef SFML_OPENGL_ES
            glCheck(glPushClientAttrib(GL_CLIENT_ALL_ATTRIB_BITS));
            glCheck(glPushAttrib(GL_ALL_ATTRIB_BITS));
        #endif
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPushMatrix());
    }

    resetGLStates();
}